

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SelectLeaf(Fts3Table *p,char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piLeaf,
                  sqlite3_int64 *piLeaf2)

{
  int iVar1;
  byte *in_RCX;
  undefined4 in_EDX;
  Fts3Table *in_RSI;
  int *in_RDI;
  undefined4 in_R8D;
  long *in_R9;
  sqlite3_int64 *unaff_retaddr;
  sqlite3_int64 *in_stack_00000008;
  int in_stack_00000014;
  char *in_stack_00000018;
  int nBlob;
  char *zBlob;
  int iHeight;
  int rc;
  int *in_stack_ffffffffffffffa8;
  int *pnLoad;
  int *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int nTerm_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((*in_RCX & 0x80) == 0) {
    in_stack_ffffffffffffffc8 = (uint)*in_RCX;
  }
  else {
    sqlite3Fts3GetVarint32((char *)in_RCX,(int *)&stack0xffffffffffffffc8);
  }
  nTerm_00 = (int)((ulong)in_RCX >> 0x20);
  iVar1 = fts3ScanInteriorNode
                    (zBlob,nBlob,in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr
                    );
  if ((iVar1 == 0) && (1 < (int)in_stack_ffffffffffffffc8)) {
    uVar2 = 0;
    if ((in_R9 != (long *)0x0) &&
       ((in_stack_00000008 != (sqlite3_int64 *)0x0 && (*in_R9 != *in_stack_00000008)))) {
      iVar1 = sqlite3Fts3ReadBlock
                        ((Fts3Table *)(ulong)in_stack_ffffffffffffffc8,0,
                         (char **)(ulong)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
      if (iVar1 == 0) {
        iVar1 = fts3SelectLeaf(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),nTerm_00,
                               (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                               (int)((ulong)in_R9 >> 0x20),
                               (sqlite3_int64 *)(ulong)in_stack_ffffffffffffffc8,unaff_retaddr);
      }
      sqlite3_free((void *)0x1b4fc9);
      in_R9 = (long *)0x0;
    }
    if (iVar1 == 0) {
      if (in_R9 == (long *)0x0) {
        pnLoad = (int *)*in_stack_00000008;
      }
      else {
        pnLoad = (int *)*in_R9;
      }
      iVar1 = sqlite3Fts3ReadBlock
                        ((Fts3Table *)(ulong)in_stack_ffffffffffffffc8,0,
                         (char **)CONCAT44(uVar2,in_stack_ffffffffffffffb8),in_RDI,pnLoad);
    }
    if (iVar1 == 0) {
      iVar1 = fts3SelectLeaf(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),nTerm_00,
                             (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                             (int)((ulong)in_R9 >> 0x20),
                             (sqlite3_int64 *)(ulong)in_stack_ffffffffffffffc8,unaff_retaddr);
    }
    sqlite3_free((void *)0x1b5072);
  }
  return iVar1;
}

Assistant:

static int fts3SelectLeaf(
  Fts3Table *p,                   /* Virtual table handle */
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piLeaf,          /* Selected leaf node */
  sqlite3_int64 *piLeaf2          /* Selected leaf node */
){
  int rc = SQLITE_OK;             /* Return code */
  int iHeight;                    /* Height of this node in tree */

  assert( piLeaf || piLeaf2 );

  fts3GetVarint32(zNode, &iHeight);
  rc = fts3ScanInteriorNode(zTerm, nTerm, zNode, nNode, piLeaf, piLeaf2);
  assert( !piLeaf2 || !piLeaf || rc!=SQLITE_OK || (*piLeaf<=*piLeaf2) );

  if( rc==SQLITE_OK && iHeight>1 ){
    char *zBlob = 0;              /* Blob read from %_segments table */
    int nBlob = 0;                /* Size of zBlob in bytes */

    if( piLeaf && piLeaf2 && (*piLeaf!=*piLeaf2) ){
      rc = sqlite3Fts3ReadBlock(p, *piLeaf, &zBlob, &nBlob, 0);
      if( rc==SQLITE_OK ){
        rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, 0);
      }
      sqlite3_free(zBlob);
      piLeaf = 0;
      zBlob = 0;
    }

    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3ReadBlock(p, piLeaf?*piLeaf:*piLeaf2, &zBlob, &nBlob, 0);
    }
    if( rc==SQLITE_OK ){
      rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, piLeaf2);
    }
    sqlite3_free(zBlob);
  }

  return rc;
}